

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<std::pair<int,int>>::emplace_back<int&,int&>
          (SmallVectorBase<std::pair<int,int>> *this,int *args,int *args_1)

{
  long lVar1;
  long lVar2;
  pointer ppVar3;
  
  lVar1 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  ppVar3 = (pointer)(lVar1 + lVar2 * 8);
  if (lVar2 == *(long *)(this + 0x10)) {
    ppVar3 = emplaceRealloc<int&,int&>(this,ppVar3,args,args_1);
    return ppVar3;
  }
  *(int *)(lVar1 + lVar2 * 8) = *args;
  *(int *)(lVar1 + 4 + lVar2 * 8) = *args_1;
  *(long *)(this + 8) = lVar2 + 1;
  return ppVar3;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }